

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O1

void __thiscall
HEkkDualRHS::chooseMultiHyperGraphPart
          (HEkkDualRHS *this,HighsInt *chIndex,HighsInt *chCount,HighsInt chLimit)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  HEkk *pHVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer piVar8;
  uint uVar9;
  uint32_t uVar10;
  int iVar11;
  ulong uVar12;
  size_type __n;
  uint32_t uVar13;
  uint32_t uVar14;
  long lVar15;
  uint32_t uVar16;
  bool bVar17;
  vector<int,_std::allocator<int>_> bestIndex;
  vector<double,_std::allocator<double>_> bestMerit;
  allocator_type local_79;
  uint local_78;
  value_type_conflict2 local_74;
  int *local_70;
  vector<int,_std::allocator<int>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  HighsInt *local_38;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x26,0);
  if (this->partNum == chLimit) {
    if (0 < chLimit) {
      memset(chIndex,0xff,(ulong)(uint)chLimit << 2);
    }
    *chCount = 0;
    pHVar5 = this->ekk_instance_;
    uVar16 = this->workCount;
    if ((int)uVar16 < 0) {
      if (uVar16 == 0xffffffff) {
        uVar10 = 0;
        local_78 = chLimit;
        local_70 = chCount;
      }
      else {
        uVar9 = 0x1f;
        if (~uVar16 != 0) {
          for (; ~uVar16 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        local_78 = chLimit;
        local_70 = chCount;
        uVar10 = HighsRandom::drawUniform(&pHVar5->random_,-uVar16,(uVar9 ^ 0xffffffe0) + 0x21);
      }
      __n = (size_type)(int)local_78;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_50,__n,(value_type_conflict1 *)&local_68,(allocator_type *)&local_74);
      local_74 = -1;
      std::vector<int,_std::allocator<int>_>::vector(&local_68,__n,&local_74,&local_79);
      pdVar7 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar11 = 0;
      do {
        uVar14 = uVar10;
        uVar13 = 0;
        if (iVar11 == 0) {
          uVar14 = -uVar16;
          uVar13 = uVar10;
        }
        if ((int)uVar13 < (int)uVar14) {
          piVar6 = (this->workPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar15 = (long)(int)uVar13;
          do {
            dVar1 = pdVar7[lVar15];
            if (1e-50 < dVar1) {
              iVar3 = piVar6[lVar15];
              dVar2 = (pHVar5->dual_edge_weight_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar15];
              if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar3] * dVar2 < dVar1) {
                local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3] = dVar1 / dVar2;
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3] = (int)lVar15;
              }
            }
            lVar15 = lVar15 + 1;
          } while ((int)uVar14 != lVar15);
        }
        bVar17 = iVar11 == 0;
        iVar11 = iVar11 + 1;
      } while (bVar17);
      if ((int)local_78 < 1) {
        iVar11 = 0;
      }
      else {
        uVar12 = 0;
        iVar11 = 0;
        do {
          if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar12] != -1) {
            lVar15 = (long)iVar11;
            iVar11 = iVar11 + 1;
            chIndex[lVar15] =
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
          }
          uVar12 = uVar12 + 1;
        } while (local_78 != uVar12);
      }
      *local_70 = iVar11;
    }
    else {
      if (uVar16 == 0) goto LAB_0035a106;
      uVar10 = 0;
      if (1 < (int)uVar16) {
        uVar9 = 0x1f;
        if (uVar16 - 1 != 0) {
          for (; uVar16 - 1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar10 = HighsRandom::drawUniform(&pHVar5->random_,uVar16,(uVar9 ^ 0xffffffe0) + 0x21);
      }
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_78 = chLimit;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_50,(long)chLimit,(value_type_conflict1 *)&local_68,
                 (allocator_type *)&local_74);
      local_74 = -1;
      local_70 = chCount;
      local_38 = chIndex;
      std::vector<int,_std::allocator<int>_>::vector(&local_68,(long)chLimit,&local_74,&local_79);
      piVar6 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar11 = 0;
      do {
        uVar13 = 0;
        uVar16 = uVar10;
        if (iVar11 == 0) {
          uVar16 = this->workCount;
          uVar13 = uVar10;
        }
        if ((int)uVar13 < (int)uVar16) {
          piVar8 = (this->workPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar15 = (long)(int)uVar13;
          do {
            iVar3 = piVar6[lVar15];
            dVar1 = pdVar7[iVar3];
            if (1e-50 < dVar1) {
              iVar4 = piVar8[iVar3];
              dVar2 = (pHVar5->dual_edge_weight_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3];
              if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4] * dVar2 < dVar1) {
                local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar4] = dVar1 / dVar2;
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar4] = iVar3;
              }
            }
            lVar15 = lVar15 + 1;
          } while ((int)uVar16 != lVar15);
        }
        bVar17 = iVar11 == 0;
        iVar11 = iVar11 + 1;
      } while (bVar17);
      if ((int)local_78 < 1) {
        iVar11 = 0;
      }
      else {
        uVar12 = 0;
        iVar11 = 0;
        do {
          if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar12] != -1) {
            lVar15 = (long)iVar11;
            iVar11 = iVar11 + 1;
            local_38[lVar15] =
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
          }
          uVar12 = uVar12 + 1;
        } while (local_78 != uVar12);
      }
      *local_70 = iVar11;
    }
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    chooseMultiGlobal(this,chIndex,chCount,chLimit);
    this->partSwitch = 0;
  }
LAB_0035a106:
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x26,0);
  return;
}

Assistant:

void HEkkDualRHS::chooseMultiHyperGraphPart(HighsInt* chIndex,
                                            HighsInt* chCount,
                                            HighsInt chLimit) {
  analysis->simplexTimerStart(ChuzrDualClock);

  // Force to use partition method, unless doesn't exist
  if (partNum != chLimit) {
    chooseMultiGlobal(chIndex, chCount, chLimit);
    partSwitch = 0;
    analysis->simplexTimerStop(ChuzrDualClock);
    return;
  }

  // Initialise
  for (HighsInt i = 0; i < chLimit; i++) chIndex[i] = -1;
  *chCount = 0;

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount < 0) {
    // DENSE mode
    const HighsInt numRow = -workCount;
    HighsInt randomStart = ekk_instance_.random_.integer(numRow);
    vector<double> bestMerit(chLimit, 0);
    vector<HighsInt> bestIndex(chLimit, -1);
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? numRow : randomStart;
      for (HighsInt iRow = start; iRow < end; iRow++) {
        if (work_infeasibility[iRow] > kHighsZero) {
          HighsInt iPart = workPartition[iRow];
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (bestMerit[iPart] * myWeight < myInfeas) {
            bestMerit[iPart] = myInfeas / myWeight;
            bestIndex[iPart] = iRow;
          }
        }
      }
    }
    HighsInt count = 0;
    for (HighsInt i = 0; i < chLimit; i++) {
      if (bestIndex[i] != -1) {
        chIndex[count++] = bestIndex[i];
      }
    }
    *chCount = count;
  } else {
    // SPARSE mode
    if (workCount == 0) {
      analysis->simplexTimerStop(ChuzrDualClock);
      return;
    }

    HighsInt randomStart = ekk_instance_.random_.integer(workCount);
    vector<double> bestMerit(chLimit, 0);
    vector<HighsInt> bestIndex(chLimit, -1);
    for (HighsInt section = 0; section < 2; section++) {
      const HighsInt start = (section == 0) ? randomStart : 0;
      const HighsInt end = (section == 0) ? workCount : randomStart;
      for (HighsInt i = start; i < end; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > kHighsZero) {
          HighsInt iPart = workPartition[iRow];
          const double myInfeas = work_infeasibility[iRow];
          const double myWeight = edge_weight[iRow];
          if (bestMerit[iPart] * myWeight < myInfeas) {
            bestMerit[iPart] = myInfeas / myWeight;
            bestIndex[iPart] = iRow;
          }
        }
      }
    }
    HighsInt count = 0;
    for (HighsInt i = 0; i < chLimit; i++) {
      if (bestIndex[i] != -1) {
        chIndex[count++] = bestIndex[i];
      }
    }
    *chCount = count;
  }

  analysis->simplexTimerStop(ChuzrDualClock);
}